

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

void cvRestore(CVodeMem cv_mem,sunrealtype saved_t)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  cv_mem->cv_tn = saved_t;
  lVar3 = 1;
  while( true ) {
    iVar1 = cv_mem->cv_q;
    lVar2 = (long)iVar1;
    if (lVar2 < lVar3) break;
    for (; lVar3 <= lVar2; lVar2 = lVar2 + -1) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_zn[lVar2 + -1],
                   cv_mem->cv_zn[lVar2],cv_mem->cv_zn[lVar2 + -1]);
    }
    lVar3 = lVar3 + 1;
  }
  if (cv_mem->cv_quadr != 0) {
    for (lVar3 = 1; lVar2 = (long)iVar1, lVar3 <= lVar2; lVar3 = lVar3 + 1) {
      for (; lVar3 <= lVar2; lVar2 = lVar2 + -1) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_znQ[lVar2 + -1],
                     cv_mem->cv_znQ[lVar2],cv_mem->cv_znQ[lVar2 + -1]);
      }
      iVar1 = cv_mem->cv_q;
    }
  }
  if (cv_mem->cv_sensi != 0) {
    for (lVar3 = 1; lVar2 = (long)iVar1, lVar3 <= lVar2; lVar3 = lVar3 + 1) {
      for (; lVar3 <= lVar2; lVar2 = lVar2 + -1) {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_Ns,cv_mem->cv_znS[lVar2 + -1],
                   cv_mem->cv_znS[lVar2]);
      }
      iVar1 = cv_mem->cv_q;
    }
  }
  if (cv_mem->cv_quadr_sensi != 0) {
    for (lVar3 = 1; lVar2 = (long)iVar1, lVar3 <= lVar2; lVar3 = lVar3 + 1) {
      for (; lVar3 <= lVar2; lVar2 = lVar2 + -1) {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,cv_mem->cv_Ns,cv_mem->cv_znQS[lVar2 + -1],
                   cv_mem->cv_znQS[lVar2]);
      }
      iVar1 = cv_mem->cv_q;
    }
  }
  return;
}

Assistant:

void cvRestore(CVodeMem cv_mem, sunrealtype saved_t)
{
  int j, k;

  cv_mem->cv_tn = saved_t;
  for (k = 1; k <= cv_mem->cv_q; k++)
  {
    for (j = cv_mem->cv_q; j >= k; j--)
    {
      N_VLinearSum(ONE, cv_mem->cv_zn[j - 1], -ONE, cv_mem->cv_zn[j],
                   cv_mem->cv_zn[j - 1]);
    }
  }

  if (cv_mem->cv_quadr)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        N_VLinearSum(ONE, cv_mem->cv_znQ[j - 1], -ONE, cv_mem->cv_znQ[j],
                     cv_mem->cv_znQ[j - 1]);
      }
    }
  }

  if (cv_mem->cv_sensi)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        (void)N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znS[j - 1],
                                      -ONE, cv_mem->cv_znS[j],
                                      cv_mem->cv_znS[j - 1]);
      }
    }
  }

  if (cv_mem->cv_quadr_sensi)
  {
    for (k = 1; k <= cv_mem->cv_q; k++)
    {
      for (j = cv_mem->cv_q; j >= k; j--)
      {
        (void)N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znQS[j - 1],
                                      -ONE, cv_mem->cv_znQS[j],
                                      cv_mem->cv_znQS[j - 1]);
      }
    }
  }
}